

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O0

void __thiscall MeasurementToString_numbers_Test::TestBody(MeasurementToString_numbers_Test *this)

{
  bool bVar1;
  uint64_t match_flags;
  char *message;
  double lhs_value;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  precise_measurement m1;
  MeasurementToString_numbers_Test *this_local;
  
  m1.units_._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"0.2",&local_49);
  match_flags = units::getDefaultFlags();
  units::measurement_from_string((precise_measurement *)local_28,&local_48,match_flags);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  lhs_value = units::precise_measurement::value((precise_measurement *)local_28);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_70,"m1.value()","0.2",lhs_value,0.2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x82,message);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST(MeasurementToString, numbers)
{
    auto m1 = measurement_from_string("0.2");
    EXPECT_DOUBLE_EQ(m1.value(), 0.2);
}